

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc_memcpy.h
# Opt level: O0

crc32c_t absl::lts_20250127::crc_internal::CrcMemcpy::CrcAndCopy
                   (void *dst,void *src,size_t length,crc32c_t initial_crc,bool non_temporal)

{
  int iVar1;
  uint32_t uVar2;
  CrcMemcpyEngine *local_68;
  CrcMemcpyEngine *engine;
  bool non_temporal_local;
  size_t length_local;
  void *src_local;
  void *dst_local;
  crc32c_t initial_crc_local;
  
  if (CrcAndCopy(void*,void_const*,unsigned_long,absl::lts_20250127::crc32c_t,bool)::engines == '\0'
     ) {
    iVar1 = __cxa_guard_acquire(&CrcAndCopy(void*,void_const*,unsigned_long,absl::lts_20250127::crc32c_t,bool)
                                 ::engines);
    if (iVar1 != 0) {
      CrcAndCopy::engines = GetArchSpecificEngines();
      __cxa_guard_release(&CrcAndCopy(void*,void_const*,unsigned_long,absl::lts_20250127::crc32c_t,bool)
                           ::engines);
    }
  }
  if (non_temporal) {
    local_68 = CrcAndCopy::engines.non_temporal;
  }
  else {
    local_68 = CrcAndCopy::engines.temporal;
  }
  uVar2 = (*local_68->_vptr_CrcMemcpyEngine[2])(local_68,dst,src,length,(ulong)initial_crc.crc_);
  return (crc32c_t)uVar2;
}

Assistant:

static crc32c_t CrcAndCopy(void* __restrict dst, const void* __restrict src,
                             std::size_t length,
                             crc32c_t initial_crc = crc32c_t{0},
                             bool non_temporal = false) {
    static const ArchSpecificEngines engines = GetArchSpecificEngines();
    auto* engine = non_temporal ? engines.non_temporal : engines.temporal;
    return engine->Compute(dst, src, length, initial_crc);
  }